

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac_prng.c
# Opt level: O2

int tc_hmac_prng_init(TCHmacPrng_t prng,uint8_t *personalization,uint plen)

{
  bool bVar1;
  
  bVar1 = personalization != (uint8_t *)0x0 && prng != (TCHmacPrng_t)0x0;
  if (bVar1) {
    _set(prng->key,'\0',0x20);
    _set(prng->v,'\x01',0x20);
    tc_hmac_set_key(&prng->h,prng->key,0x20);
    update(prng,personalization,plen);
    prng->countdown = 0;
  }
  return (uint)bVar1;
}

Assistant:

int tc_hmac_prng_init(TCHmacPrng_t prng,
		      const uint8_t *personalization,
		      unsigned int plen)
{

	/* input sanity check: */
	if (prng == (TCHmacPrng_t) 0 ||
	    personalization == (uint8_t *) 0 ||
	    plen > MAX_PLEN) {
		return TC_CRYPTO_FAIL;
	}

	/* put the generator into a known state: */
	_set(prng->key, 0x00, sizeof(prng->key));
	_set(prng->v, 0x01, sizeof(prng->v));
	tc_hmac_set_key(&prng->h, prng->key, sizeof(prng->key));
	/* update assumes SOME key has been configured into HMAC */

	update(prng, personalization, plen);

	/* force a reseed before allowing tc_hmac_prng_generate to succeed: */
	prng->countdown = 0;

	return TC_CRYPTO_SUCCESS;
}